

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O3

drwav_int32 *
drwav__read_pcm_frames_and_close_s32
          (drwav *pWav,uint *channels,uint *sampleRate,drwav_uint64 *totalFrameCount)

{
  _func_void_ptr_size_t_void_ptr *p_Var1;
  _func_void_ptr_void_ptr_size_t_void_ptr *p_Var2;
  _func_void_void_ptr_void_ptr *p_Var3;
  size_t sVar4;
  drwav_int32 *pBufferOut;
  drwav_uint64 dVar5;
  
  sVar4 = (ulong)pWav->channels * pWav->totalPCMFrameCount * 4;
  p_Var1 = (pWav->allocationCallbacks).onMalloc;
  if (p_Var1 == (_func_void_ptr_size_t_void_ptr *)0x0) {
    p_Var2 = (pWav->allocationCallbacks).onRealloc;
    if (p_Var2 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) goto LAB_00108361;
    pBufferOut = (drwav_int32 *)(*p_Var2)((void *)0x0,sVar4,(pWav->allocationCallbacks).pUserData);
  }
  else {
    pBufferOut = (drwav_int32 *)(*p_Var1)(sVar4,(pWav->allocationCallbacks).pUserData);
  }
  if (pBufferOut != (drwav_int32 *)0x0) {
    dVar5 = drwav_read_pcm_frames_s32(pWav,pWav->totalPCMFrameCount,pBufferOut);
    if (dVar5 == pWav->totalPCMFrameCount) {
      drwav_uninit(pWav);
      if (sampleRate != (uint *)0x0) {
        *sampleRate = pWav->sampleRate;
      }
      if (channels != (uint *)0x0) {
        *channels = (uint)pWav->channels;
      }
      if (totalFrameCount == (drwav_uint64 *)0x0) {
        return pBufferOut;
      }
      *totalFrameCount = pWav->totalPCMFrameCount;
      return pBufferOut;
    }
    p_Var3 = (pWav->allocationCallbacks).onFree;
    if (p_Var3 != (_func_void_void_ptr_void_ptr *)0x0) {
      (*p_Var3)(pBufferOut,(pWav->allocationCallbacks).pUserData);
    }
  }
LAB_00108361:
  drwav_uninit(pWav);
  return (drwav_int32 *)0x0;
}

Assistant:

static drwav_int32* drwav__read_pcm_frames_and_close_s32(drwav* pWav, unsigned int* channels, unsigned int* sampleRate, drwav_uint64* totalFrameCount)
{
    drwav_uint64 sampleDataSize;
    drwav_int32* pSampleData;
    drwav_uint64 framesRead;

    DRWAV_ASSERT(pWav != NULL);

    sampleDataSize = pWav->totalPCMFrameCount * pWav->channels * sizeof(drwav_int32);
    if (sampleDataSize > DRWAV_SIZE_MAX) {
        drwav_uninit(pWav);
        return NULL;    /* File's too big. */
    }

    pSampleData = (drwav_int32*)drwav__malloc_from_callbacks((size_t)sampleDataSize, &pWav->allocationCallbacks); /* <-- Safe cast due to the check above. */
    if (pSampleData == NULL) {
        drwav_uninit(pWav);
        return NULL;    /* Failed to allocate memory. */
    }

    framesRead = drwav_read_pcm_frames_s32(pWav, (size_t)pWav->totalPCMFrameCount, pSampleData);
    if (framesRead != pWav->totalPCMFrameCount) {
        drwav__free_from_callbacks(pSampleData, &pWav->allocationCallbacks);
        drwav_uninit(pWav);
        return NULL;    /* There was an error reading the samples. */
    }

    drwav_uninit(pWav);

    if (sampleRate) {
        *sampleRate = pWav->sampleRate;
    }
    if (channels) {
        *channels = pWav->channels;
    }
    if (totalFrameCount) {
        *totalFrameCount = pWav->totalPCMFrameCount;
    }

    return pSampleData;
}